

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

LValue * __thiscall
slang::ast::NamedValueExpression::evalLValueImpl
          (LValue *__return_storage_ptr__,NamedValueExpression *this,EvalContext *context)

{
  bool bVar1;
  ConstantValue *pCVar2;
  Diagnostic *pDVar3;
  SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
  *ctx;
  SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
  local_190 [3];
  
  bVar1 = checkConstant(this,context);
  if (bVar1) {
    pCVar2 = EvalContext::findLocal(context,(this->super_ValueExpressionBase).symbol);
    if (pCVar2 != (ConstantValue *)0x0) {
      local_190[0].data_ = (pointer)local_190[0].firstElement;
      local_190[0].len = 0;
      local_190[0].cap = 4;
      *(ConstantValue **)
       &(__return_storage_ptr__->value).
        super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
        super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
        .
        super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
        .
        super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
        .
        super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
        .
        super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           = pCVar2;
      ctx = local_190;
      SmallVector<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>,_4UL>
      ::SmallVector((SmallVector<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>,_4UL>
                     *)((long)&(__return_storage_ptr__->value).
                               super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                               .
                               super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                               .
                               super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                               .
                               super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                               .
                               super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                               .
                               super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                       + 8),local_190);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
       + 0x180) = '\x01';
      SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
      ::cleanup(local_190,(EVP_PKEY_CTX *)ctx);
      return __return_storage_ptr__;
    }
    pDVar3 = EvalContext::addDiag
                       (context,(DiagCode)0x15000c,
                        (this->super_ValueExpressionBase).super_Expression.sourceRange);
    pDVar3 = Diagnostic::operator<<
                       (pDVar3,(((this->super_ValueExpressionBase).symbol)->super_Symbol).name);
    Diagnostic::addNote(pDVar3,(DiagCode)0x50001,
                        (((this->super_ValueExpressionBase).symbol)->super_Symbol).location);
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
   + 0x180) = '\0';
  return __return_storage_ptr__;
}

Assistant:

LValue NamedValueExpression::evalLValueImpl(EvalContext& context) const {
    if (!checkConstant(context))
        return nullptr;

    auto cv = context.findLocal(&symbol);
    if (!cv) {
        auto& diag = context.addDiag(diag::ConstEvalNonConstVariable, sourceRange) << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        return nullptr;
    }

    return LValue(*cv);
}